

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_prediction_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_369d94::HighbdDrPredTest_OperationCheck_Test::
~HighbdDrPredTest_OperationCheck_Test(HighbdDrPredTest_OperationCheck_Test *this)

{
  void *in_RDI;
  
  ~HighbdDrPredTest_OperationCheck_Test((HighbdDrPredTest_OperationCheck_Test *)0x516798);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(HighbdDrPredTest, OperationCheck) {
  if (params_.tst_fn == nullptr) return;
  for (enable_upsample_ = 0; enable_upsample_ < 2; ++enable_upsample_) {
    for (int angle = start_angle_; angle < stop_angle_; angle++) {
      dx_ = av1_get_dx(angle);
      dy_ = av1_get_dy(angle);
      if (dx_ && dy_) RunTest(false, false, angle);
    }
  }
}